

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t spvtools::val::ControlFlowPass(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  spv_result_t sVar2;
  spv_result_t error_5;
  spv_result_t error_4;
  spv_result_t error_3;
  spv_result_t error_2;
  spv_result_t error_1;
  spv_result_t error;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  OVar1 = Instruction::opcode(inst);
  switch(OVar1) {
  case OpPhi:
    sVar2 = anon_unknown_22::ValidatePhi(_,inst);
    goto joined_r0x002afb71;
  case OpLoopMerge:
    sVar2 = anon_unknown_22::ValidateLoopMerge(_,inst);
joined_r0x002afb71:
    if (sVar2 != SPV_SUCCESS) {
      return sVar2;
    }
    goto LAB_002afb7f;
  default:
    goto LAB_002afb7f;
  case OpBranch:
    __local._4_4_ = anon_unknown_22::ValidateBranch(_,inst);
    break;
  case OpBranchConditional:
    __local._4_4_ = anon_unknown_22::ValidateBranchConditional(_,inst);
    break;
  case OpSwitch:
    __local._4_4_ = anon_unknown_22::ValidateSwitch(_,inst);
    break;
  case OpReturnValue:
    __local._4_4_ = anon_unknown_22::ValidateReturnValue(_,inst);
  }
  if (__local._4_4_ == SPV_SUCCESS) {
LAB_002afb7f:
    __local._4_4_ = SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ControlFlowPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpPhi:
      if (auto error = ValidatePhi(_, inst)) return error;
      break;
    case spv::Op::OpBranch:
      if (auto error = ValidateBranch(_, inst)) return error;
      break;
    case spv::Op::OpBranchConditional:
      if (auto error = ValidateBranchConditional(_, inst)) return error;
      break;
    case spv::Op::OpReturnValue:
      if (auto error = ValidateReturnValue(_, inst)) return error;
      break;
    case spv::Op::OpSwitch:
      if (auto error = ValidateSwitch(_, inst)) return error;
      break;
    case spv::Op::OpLoopMerge:
      if (auto error = ValidateLoopMerge(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}